

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  bool bVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  bool bVar12;
  string *inexpr;
  pointer pMVar13;
  ulong uVar14;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  GlobMessages globMessages;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Glob g;
  string variable;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmFileCommand.cxx"
                  ,0x37b,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  std::__cxx11::string::string((string *)&variable,(string *)(pbVar1 + 1));
  cmsys::Glob::Glob(&g);
  g.Recurse = recurse;
  PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009);
  if (PVar6 < (REQUIRED_ALWAYS|WARN) && recurse) {
    g.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar6 * '\b' & 0x3fU),0);
  }
  std::__cxx11::string::string((string *)&output,"",(allocator *)&expr);
  bVar12 = true;
  bVar5 = false;
  pbVar11 = pbVar1 + 2;
  uVar10 = extraout_RDX;
  do {
    __lhs = pbVar11;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__lhs == pbVar2) {
      if (((recurse) && (PVar6 < NEW && !bVar5)) && (g.FollowedSymlinkCount != 0)) {
        pcVar3 = (this->super_cmCommand).Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&expr,(cmPolicies *)0x9,(PolicyID)uVar10);
        cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
        std::__cxx11::string::~string((string *)&expr);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&variable,output._M_dataplus._M_p);
      break;
    }
    bVar4 = std::operator==(__lhs,"LIST_DIRECTORIES");
    pbVar11 = __lhs;
    if (bVar4) {
      pbVar11 = __lhs + 1;
      if (pbVar11 !=
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        bVar4 = cmSystemTools::IsOn((pbVar11->_M_dataplus)._M_p);
        bVar9 = true;
        if (!bVar4) {
          bVar4 = cmSystemTools::IsOff((pbVar11->_M_dataplus)._M_p);
          if (!bVar4) {
            std::__cxx11::string::string
                      ((string *)&expr,"LIST_DIRECTORIES missing bool value.",
                       (allocator *)&local_148);
            cmCommand::SetError(&this->super_cmCommand,&expr);
            goto LAB_003a737a;
          }
          bVar9 = false;
        }
        pbVar11 = __lhs + 2;
        g.ListDirs = bVar9;
        g.RecurseListDirs = bVar9;
        goto LAB_003a6f47;
      }
      std::__cxx11::string::string
                ((string *)&expr,"LIST_DIRECTORIES missing bool value.",(allocator *)&local_148);
      cmCommand::SetError(&this->super_cmCommand,&expr);
LAB_003a737a:
      std::__cxx11::string::~string((string *)&expr);
      break;
    }
LAB_003a6f47:
    if ((recurse) && (bVar4 = std::operator==(pbVar11,"FOLLOW_SYMLINKS"), bVar4)) {
      g.RecurseThroughSymlinks = true;
      pbVar11 = pbVar11 + 1;
      bVar5 = true;
      if (pbVar11 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string
                  ((string *)&expr,"GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS",
                   (allocator *)&local_148);
        cmCommand::SetError(&this->super_cmCommand,&expr);
        goto LAB_003a737a;
      }
    }
    bVar4 = std::operator==(pbVar11,"RELATIVE");
    if (bVar4) {
      if (pbVar11 + 1 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string
                  ((string *)&expr,"GLOB requires a directory after the RELATIVE tag",
                   (allocator *)&local_148);
        cmCommand::SetError(&this->super_cmCommand,&expr);
      }
      else {
        cmsys::Glob::SetRelative(&g,pbVar11[1]._M_dataplus._M_p);
        pbVar11 = pbVar11 + 2;
        if (pbVar11 !=
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) goto LAB_003a6fd9;
        std::__cxx11::string::string
                  ((string *)&expr,"GLOB requires a glob expression after the directory",
                   (allocator *)&local_148);
        cmCommand::SetError(&this->super_cmCommand,&expr);
      }
      goto LAB_003a737a;
    }
LAB_003a6fd9:
    globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = cmsys::SystemTools::FileIsFullPath((pbVar11->_M_dataplus)._M_p);
    if (bVar4) {
      cmsys::Glob::FindFiles(&g,pbVar11,&globMessages);
    }
    else {
      pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&expr,pcVar7,(allocator *)&local_148);
      inexpr = pbVar11;
      if (expr._M_string_length != 0) {
        std::operator+(&local_148,"/",pbVar11);
        std::__cxx11::string::append((string *)&expr);
        std::__cxx11::string::~string((string *)&local_148);
        inexpr = &expr;
      }
      cmsys::Glob::FindFiles(&g,inexpr,&globMessages);
      std::__cxx11::string::~string((string *)&expr);
    }
    if (globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003a71b6:
      pvVar8 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
      for (uVar14 = 0;
          uVar14 < (ulong)((long)(pvVar8->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar8->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar14 = uVar14 + 1) {
        if (!bVar12) {
          std::__cxx11::string::append((char *)&output);
        }
        std::__cxx11::string::append((string *)&output);
        bVar12 = false;
      }
      bVar4 = true;
    }
    else {
      bVar4 = false;
      for (pMVar13 = globMessages.
                     super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pMVar13 !=
          globMessages.
          super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
          super__Vector_impl_data._M_finish; pMVar13 = pMVar13 + 1) {
        pcVar3 = (this->super_cmCommand).Makefile;
        if (pMVar13->type == cyclicRecursion) {
          std::operator+(&local_c8,"Cyclic recursion detected while globbing for \'",pbVar11);
          std::operator+(&local_148,&local_c8,"\':\n");
          std::operator+(&expr,&local_148,&pMVar13->content);
          cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
          std::__cxx11::string::~string((string *)&expr);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        else {
          std::operator+(&local_c8,"Error has occured while globbing for \'",pbVar11);
          std::operator+(&local_148,&local_c8,"\' - ");
          std::operator+(&expr,&local_148,&pMVar13->content);
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&expr);
          std::__cxx11::string::~string((string *)&expr);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_c8);
          bVar4 = true;
        }
      }
      if (!bVar4) goto LAB_003a71b6;
      bVar4 = false;
    }
    std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&globMessages)
    ;
    pbVar11 = pbVar11 + 1;
    uVar10 = extraout_RDX_00;
  } while (bVar4);
  std::__cxx11::string::~string((string *)&output);
  cmsys::Glob::~Glob(&g);
  std::__cxx11::string::~string((string *)&variable);
  return __lhs == pbVar2;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
  bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if(recurse)
    {
    switch(status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
      }
    }

  std::string output = "";
  bool first = true;
  for ( ; i != args.end(); ++i )
    {
    if( *i == "LIST_DIRECTORIES" )
      {
      ++i;
      if(i != args.end())
        {
        if(cmSystemTools::IsOn(i->c_str()))
          {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
          }
        else if(cmSystemTools::IsOff(i->c_str()))
          {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
          }
        else
          {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
          }
        }
      else
        {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
        }
      ++i;
      }

    if ( recurse && (*i == "FOLLOW_SYMLINKS") )
      {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if ( i == args.end() )
        {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
        }
      }

    if ( *i == "RELATIVE" )
      {
      ++i; // skip RELATIVE
      if ( i == args.end() )
        {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
        }
      g.SetRelative(i->c_str());
      ++i;
      if(i == args.end())
        {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
        }
      }

    cmsys::Glob::GlobMessages globMessages;
    if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
      {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty())
        {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
        }
      else
        {
        g.FindFiles(*i, &globMessages);
        }
      }
    else
      {
      g.FindFiles(*i, &globMessages);
      }

    if(!globMessages.empty())
      {
      bool shouldExit = false;
      for(cmsys::Glob::GlobMessagesIterator it=globMessages.begin();
        it != globMessages.end(); ++it)
        {
        if(it->type == cmsys::Glob::cyclicRecursion)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '"
            + *i + "':\n" + it->content);
          }
        else
          {
          this->Makefile->IssueMessage(cmake::FATAL_ERROR,
            "Error has occured while globbing for '"
            + *i + "' - " + it->content);
          shouldExit = true;
          }
        }
      if(shouldExit)
        {
          return false;
        }
      }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    for ( cc = 0; cc < files.size(); cc ++ )
      {
      if ( !first )
        {
        output += ";";
        }
      output += files[cc];
      first = false;
      }
    }

  if(recurse && !explicitFollowSymlinks)
    {
    switch (status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
        // Probably not really the expected behavior, but the author explicitly
        // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if(g.GetFollowedSymlinkCount() != 0)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
          }
        break;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}